

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeClassConstants
               (ExpressionContext *ctx,SynBase *source,TypeBase *type,
               IntrusiveList<SynConstant> constants,IntrusiveList<ConstantData> *target)

{
  bool bVar1;
  ExprBase *pEVar2;
  ExprIntegerLiteral *this;
  ConstantData *this_00;
  SynConstant *pSVar3;
  InplaceStr name;
  ConstantData *local_50;
  ConstantData *curr;
  ExprBase *value;
  SynConstant *constant;
  IntrusiveList<ConstantData> *target_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  IntrusiveList<SynConstant> constants_local;
  
  pSVar3 = constants.tail;
  value = (ExprBase *)constants.head;
  target_local = (IntrusiveList<ConstantData> *)type;
  do {
    if (value == (ExprBase *)0x0) {
      return;
    }
    if (value[1].type == (TypeBase *)0x0) {
      bVar1 = ExpressionContext::IsIntegerType(ctx,(TypeBase *)target_local);
      if ((!bVar1) || (bVar1 = IntrusiveList<ConstantData>::empty(target), bVar1)) {
        if ((SynConstant *)value == constants.head) {
          anon_unknown.dwarf_e7629::Report(ctx,source,"ERROR: \'=\' not found after constant name");
        }
        else {
          anon_unknown.dwarf_e7629::Report
                    (ctx,source,
                     "ERROR: only integer constant list gets automatically incremented by 1");
        }
        curr = (ConstantData *)ExpressionContext::get<ExprIntegerLiteral>(ctx);
        ExprIntegerLiteral::ExprIntegerLiteral
                  ((ExprIntegerLiteral *)curr,(SynBase *)value,ctx->typeInt,0);
      }
      else {
        pEVar2 = target->tail->value;
        this = ExpressionContext::get<ExprIntegerLiteral>(ctx);
        ExprIntegerLiteral::ExprIntegerLiteral(this,(SynBase *)value,(TypeBase *)target_local,1);
        pEVar2 = CreateBinaryOp(ctx,(SynBase *)value,SYN_BINARY_OP_ADD,pEVar2,&this->super_ExprBase)
        ;
        pSVar3 = (SynConstant *)0x0;
        pEVar2 = CreateCast(ctx,(SynBase *)value,pEVar2,(TypeBase *)target_local,false);
        pEVar2 = anon_unknown.dwarf_e7629::EvaluateExpression(ctx,source,pEVar2);
        curr = (ConstantData *)getType<ExprIntegerLiteral>(pEVar2);
      }
LAB_0025a6d5:
      if ((curr == (ConstantData *)0x0) ||
         ((((bVar1 = isType<ExprBoolLiteral>((ExprBase *)curr), !bVar1 &&
            (bVar1 = isType<ExprCharacterLiteral>((ExprBase *)curr), !bVar1)) &&
           (bVar1 = isType<ExprIntegerLiteral>((ExprBase *)curr), !bVar1)) &&
          (bVar1 = isType<ExprRationalLiteral>((ExprBase *)curr), !bVar1)))) {
        anon_unknown.dwarf_e7629::Report
                  (ctx,source,"ERROR: expression didn\'t evaluate to a constant number");
        curr = (ConstantData *)ExpressionContext::get<ExprIntegerLiteral>(ctx);
        ExprIntegerLiteral::ExprIntegerLiteral
                  ((ExprIntegerLiteral *)curr,(SynBase *)value,ctx->typeInt,0);
      }
      for (local_50 = target->head; local_50 != (ConstantData *)0x0; local_50 = local_50->next) {
        bVar1 = InplaceStr::operator==((InplaceStr *)(value[1].source + 1),&local_50->name->name);
        if (bVar1) {
          pSVar3 = (SynConstant *)(local_50->name->name).begin;
          anon_unknown.dwarf_e7629::Report
                    (ctx,source,"ERROR: name \'%.*s\' is already taken",
                     (ulong)(uint)((int)(local_50->name->name).end -
                                  (int)(local_50->name->name).begin));
        }
      }
      name.end = (char *)pSVar3;
      name.begin = *(char **)&value[1].source[1].typeID;
      anon_unknown.dwarf_e7629::CheckVariableConflict
                ((anon_unknown_dwarf_e7629 *)ctx,(ExpressionContext *)value,
                 (SynBase *)value[1].source[1]._vptr_SynBase,name);
      this_00 = ExpressionContext::get<ConstantData>(ctx);
      ConstantData::ConstantData(this_00,(SynIdentifier *)value[1].source,(ExprBase *)curr);
      IntrusiveList<ConstantData>::push_back(target,this_00);
    }
    else {
      pEVar2 = AnalyzeExpression(ctx,(SynBase *)value[1].type);
      bVar1 = isType<TypeError>(pEVar2->type);
      if (!bVar1) {
        if ((TypeBase *)target_local == ctx->typeAuto) {
          target_local = (IntrusiveList<ConstantData> *)pEVar2->type;
        }
        bVar1 = ExpressionContext::IsNumericType(ctx,(TypeBase *)target_local);
        if (!bVar1) {
          anon_unknown.dwarf_e7629::Stop
                    (ctx,source,"ERROR: only basic numeric types can be used as constants");
        }
        pSVar3 = (SynConstant *)0x0;
        pEVar2 = CreateCast(ctx,(SynBase *)value,pEVar2,(TypeBase *)target_local,false);
        curr = (ConstantData *)anon_unknown.dwarf_e7629::EvaluateExpression(ctx,source,pEVar2);
        goto LAB_0025a6d5;
      }
    }
    value = (ExprBase *)getType<SynConstant>((SynBase *)value[1]._vptr_ExprBase);
  } while( true );
}

Assistant:

void AnalyzeClassConstants(ExpressionContext &ctx, SynBase *source, TypeBase *type, IntrusiveList<SynConstant> constants, IntrusiveList<ConstantData> &target)
{
	for(SynConstant *constant = constants.head; constant; constant = getType<SynConstant>(constant->next))
	{
		ExprBase *value = NULL;
			
		if(constant->value)
		{
			value = AnalyzeExpression(ctx, constant->value);

			if(isType<TypeError>(value->type))
				continue;

			if(type == ctx.typeAuto)
				type = value->type;

			if(!ctx.IsNumericType(type))
				Stop(ctx, source, "ERROR: only basic numeric types can be used as constants");

			value = EvaluateExpression(ctx, source, CreateCast(ctx, constant, value, type, false));
		}
		else if(ctx.IsIntegerType(type) && !target.empty())
		{
			value = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, CreateCast(ctx, constant, CreateBinaryOp(ctx, constant, SYN_BINARY_OP_ADD, target.tail->value, new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, type, 1)), type, false)));
		}
		else
		{
			if(constant == constants.head)
				Report(ctx, source, "ERROR: '=' not found after constant name");
			else
				Report(ctx, source, "ERROR: only integer constant list gets automatically incremented by 1");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		if(!value || (!isType<ExprBoolLiteral>(value) && !isType<ExprCharacterLiteral>(value) && !isType<ExprIntegerLiteral>(value) && !isType<ExprRationalLiteral>(value)))
		{
			Report(ctx, source, "ERROR: expression didn't evaluate to a constant number");

			value = new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(constant, ctx.typeInt, 0);
		}

		for(ConstantData *curr = target.head; curr; curr = curr->next)
		{
			if(constant->name->name == curr->name->name)
				Report(ctx, source, "ERROR: name '%.*s' is already taken", FMT_ISTR(curr->name->name));
		}

		CheckVariableConflict(ctx, constant, constant->name->name);

		target.push_back(new (ctx.get<ConstantData>()) ConstantData(constant->name, value));
	}
}